

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

int __thiscall EntryBTree::equalKeyCompareOp(EntryBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  EntryKey *in_RSI;
  uint32_t extIndex;
  uint32_t nameIndex;
  uchar flags;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t *local_20;
  EntryKey *local_18;
  int local_4;
  
  local_18 = in_RSI;
  bVar1 = readNext<unsigned_char,unsigned_char>
                    ((uchar **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar3 = decodeBitsAndAdvance(&local_20);
  uVar2 = EntryKey::nameIndex(local_18);
  if (uVar2 < (uint)uVar3) {
    local_4 = -1;
  }
  else {
    uVar2 = EntryKey::nameIndex(local_18);
    if ((uint)uVar3 < uVar2) {
      local_4 = 1;
    }
    else {
      if ((bVar1 & 2) == 0) {
        uVar4 = 0;
      }
      else {
        uVar3 = decodeBitsAndAdvance(&local_20);
        uVar4 = (uint)uVar3;
      }
      uVar2 = EntryKey::extIndex(local_18);
      if (uVar2 < uVar4) {
        local_4 = -1;
      }
      else {
        uVar2 = EntryKey::extIndex(local_18);
        if (uVar4 < uVar2) {
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int equalKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		
		const auto nameIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nameIndex() < nameIndex)
			return -1;
		else if (key.nameIndex() > nameIndex)
			return 1;
		
		const auto extIndex = (flags & EntryKey::FLAG_FILE) != 0 ? static_cast<uint32_t>(decodeBitsAndAdvance(data)) : 0;
		if (key.extIndex() < extIndex)
			return -1;
		else if (key.extIndex() > extIndex)
			return 1;
			
		return 0;
	}